

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowMovingDevice::IfcFlowMovingDevice(IfcFlowMovingDevice *this)

{
  IfcFlowMovingDevice *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcDistributionFlowElement).field_0x168,"IfcFlowMovingDevice");
  IfcDistributionFlowElement::IfcDistributionFlowElement
            (&this->super_IfcDistributionFlowElement,&PTR_construction_vtable_24__00f20378);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowMovingDevice,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowMovingDevice,_0UL> *)
             &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.field_0x158,
             &PTR_construction_vtable_24__00f20500);
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0xf20220;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).field_0x168 = 0xf20360;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0xf20248;
  (this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xf20270;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0xf20298;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0xf202c0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x138 = 0xf202e8;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x148 = 0xf20310;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.field_0x158
       = 0xf20338;
  return;
}

Assistant:

IfcFlowMovingDevice() : Object("IfcFlowMovingDevice") {}